

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comment_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Comment_PDU::SetVariableDatum
          (Comment_PDU *this,
          vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
          *VD)

{
  KUINT16 *pKVar1;
  pointer pKVar2;
  int iVar3;
  pointer pKVar4;
  
  std::
  vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
  ::operator=(&this->m_vVariableDatum,VD);
  pKVar2 = (this->m_vVariableDatum).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar4 = (this->m_vVariableDatum).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this->m_ui32NumVariableDatum = (int)((ulong)((long)pKVar2 - (long)pKVar4) >> 3) * -0x55555555;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength =
       (short)this->m_ui32NumFixedDatum * 8 + 0x20;
  for (; pKVar2 != pKVar4; pKVar4 = pKVar4 + 1) {
    iVar3 = (*(pKVar4->m_pRef->super_DataTypeBase)._vptr_DataTypeBase[9])();
    pKVar1 = &(this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength;
    *pKVar1 = *pKVar1 + (short)iVar3;
  }
  return;
}

Assistant:

void Comment_PDU::SetVariableDatum( const vector<VarDtmPtr> & VD )
{
    m_vVariableDatum = VD;
    m_ui32NumVariableDatum = m_vVariableDatum.size();

    // Reset length
    m_ui16PDULength = COMMENT_PDU_SIZE + ( m_ui32NumFixedDatum * FixedDatum::FIXED_DATUM_SIZE );

    // Calculate the new length
    vector<VarDtmPtr>::const_iterator citr = m_vVariableDatum.begin();
    vector<VarDtmPtr>::const_iterator citrEnd = m_vVariableDatum.end();
    for( ; citr != citrEnd; ++citr )
    {
        m_ui16PDULength += ( *citr )->GetPDULength();
    }
}